

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxIn
          (vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
           *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          Privkey *blinding_key,Privkey *token_blinding_key)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  reference pvVar4;
  undefined8 uVar5;
  size_t sVar6;
  UnblindParameter *in_stack_fffffffffffff798;
  UnblindParameter *in_stack_fffffffffffff7a0;
  UnblindParameter *this_00;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  undefined8 in_stack_fffffffffffff7b8;
  CfdError error_code;
  UnblindParameter *in_stack_fffffffffffff7c0;
  undefined1 local_7b0 [88];
  ConfidentialValue local_758;
  ByteData256 local_730;
  ByteData256 local_718;
  ByteData local_700;
  Script local_6e8;
  ConfidentialValue local_6b0;
  UnblindParameter local_688;
  ConfidentialValue local_5f8;
  ByteData local_5d0;
  ByteData local_5b8;
  Script local_5a0;
  ConfidentialValue local_568;
  UnblindParameter local_540;
  ConfidentialValue local_4b0;
  undefined1 local_488 [8];
  UnblindParameter token_unblind;
  UnblindParameter asset_unblind;
  ByteData token_rangeproof;
  ByteData amount_rangeproof;
  ByteData256 local_320;
  Txid local_308;
  undefined1 local_2e8 [8];
  IssuanceParameter issue;
  string local_270 [32];
  CfdSourceLocation local_250;
  byte local_231;
  ByteData local_230;
  byte local_211;
  ByteData local_210;
  byte local_1f1;
  ConfidentialValue local_1f0;
  ConfidentialValue local_1b8;
  undefined1 local_190 [8];
  ConfidentialTxIn tx_in;
  Privkey *token_blinding_key_local;
  Privkey *blinding_key_local;
  ConfidentialTransaction *pCStack_18;
  uint32_t tx_in_index_local;
  ConfidentialTransaction *this_local;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *result;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff7b8 >> 0x20);
  tx_in.pegin_witness_.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &token_blinding_key->data_;
  blinding_key_local._4_4_ = tx_in_index;
  pCStack_18 = this;
  this_local = (ConfidentialTransaction *)__return_storage_ptr__;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0xb32,"UnblindTxIn");
  pvVar4 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ::operator[](&this->vin_,(ulong)blinding_key_local._4_4_);
  ConfidentialTxIn::ConfidentialTxIn((ConfidentialTxIn *)local_190,pvVar4);
  local_1f1 = 0;
  local_211 = 0;
  local_231 = 0;
  ConfidentialTxIn::GetIssuanceAmount(&local_1b8,(ConfidentialTxIn *)local_190);
  bVar1 = ConfidentialValue::HasBlinding(&local_1b8);
  if (!bVar1) {
    ConfidentialTxIn::GetInflationKeys(&local_1f0,(ConfidentialTxIn *)local_190);
    local_1f1 = 1;
    bVar2 = ConfidentialValue::HasBlinding(&local_1f0);
    bVar1 = true;
    if (!bVar2) goto LAB_004e2bf1;
  }
  ConfidentialTxIn::GetIssuanceAmountRangeproof(&local_210,(ConfidentialTxIn *)local_190);
  local_211 = 1;
  sVar6 = ByteData::GetDataSize(&local_210);
  bVar1 = false;
  if (sVar6 == 0) {
    ConfidentialTxIn::GetInflationKeysRangeproof(&local_230,(ConfidentialTxIn *)local_190);
    local_231 = 1;
    sVar6 = ByteData::GetDataSize(&local_230);
    bVar1 = sVar6 == 0;
  }
LAB_004e2bf1:
  if ((local_231 & 1) != 0) {
    ByteData::~ByteData((ByteData *)0x4e2c14);
  }
  if ((local_211 & 1) != 0) {
    ByteData::~ByteData((ByteData *)0x4e2c2b);
  }
  if ((local_1f1 & 1) != 0) {
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4e2c42);
  }
  ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4e2c4e);
  if (!bVar1) {
    AbstractTxIn::GetTxid(&local_308,(AbstractTxIn *)local_190);
    uVar3 = AbstractTxIn::GetVout((AbstractTxIn *)local_190);
    ConfidentialTxIn::GetAssetEntropy(&local_320,(ConfidentialTxIn *)local_190);
    ConfidentialTxIn::GetBlindingNonce
              ((ByteData256 *)
               &amount_rangeproof.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ConfidentialTxIn *)local_190);
    CalculateIssuanceValue
              ((IssuanceParameter *)local_2e8,&local_308,uVar3,true,&local_320,
               (ByteData256 *)
               &amount_rangeproof.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ByteData256::~ByteData256((ByteData256 *)0x4e2edb);
    ByteData256::~ByteData256((ByteData256 *)0x4e2ee7);
    Txid::~Txid((Txid *)0x4e2ef3);
    ConfidentialTxIn::GetIssuanceAmountRangeproof
              ((ByteData *)
               &token_rangeproof.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ConfidentialTxIn *)local_190);
    ConfidentialTxIn::GetInflationKeysRangeproof
              ((ByteData *)&asset_unblind.value.version_,(ConfidentialTxIn *)local_190);
    UnblindParameter::UnblindParameter(in_stack_fffffffffffff7c0);
    UnblindParameter::UnblindParameter(in_stack_fffffffffffff7c0);
    ConfidentialTxIn::GetIssuanceAmount(&local_4b0,(ConfidentialTxIn *)local_190);
    bVar1 = ConfidentialValue::HasBlinding(&local_4b0);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4e2f6c);
    if (bVar1) {
      ConfidentialTxIn::GetIssuanceAmount(&local_568,(ConfidentialTxIn *)local_190);
      Script::Script(&local_5a0);
      CalculateUnblindIssueData
                (&local_540,blinding_key,
                 (ByteData *)
                 &token_rangeproof.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_568,&local_5a0,
                 (ConfidentialAssetId *)
                 &issue.entropy.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      UnblindParameter::operator=(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      UnblindParameter::~UnblindParameter(in_stack_fffffffffffff7a0);
      Script::~Script((Script *)in_stack_fffffffffffff7a0);
      ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4e3013);
      ByteData::ByteData(&local_5b8);
      ByteData::operator=((ByteData *)
                          &token_rangeproof.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,&local_5b8);
      ByteData::~ByteData((ByteData *)0x4e3042);
    }
    ConfidentialTxIn::GetInflationKeysRangeproof(&local_5d0,(ConfidentialTxIn *)local_190);
    sVar6 = ByteData::GetDataSize(&local_5d0);
    ByteData::~ByteData((ByteData *)0x4e31d9);
    if (sVar6 != 0) {
      ConfidentialTxIn::GetInflationKeys(&local_5f8,(ConfidentialTxIn *)local_190);
      bVar1 = ConfidentialValue::HasBlinding(&local_5f8);
      ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4e321d);
      if (bVar1) {
        bVar1 = Privkey::IsValid(token_blinding_key);
        if (!bVar1) {
          token_blinding_key = blinding_key;
        }
        ConfidentialTxIn::GetInflationKeys(&local_6b0,(ConfidentialTxIn *)local_190);
        Script::Script(&local_6e8);
        CalculateUnblindIssueData
                  (&local_688,token_blinding_key,(ByteData *)&asset_unblind.value.version_,
                   &local_6b0,&local_6e8,(ConfidentialAssetId *)&issue.asset.version_);
        UnblindParameter::operator=(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        UnblindParameter::~UnblindParameter(in_stack_fffffffffffff7a0);
        Script::~Script((Script *)in_stack_fffffffffffff7a0);
        ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4e3302);
        ByteData::ByteData(&local_700);
        ByteData::operator=((ByteData *)&asset_unblind.value.version_,&local_700);
        ByteData::~ByteData((ByteData *)0x4e3331);
      }
    }
    uVar3 = blinding_key_local._4_4_;
    ConfidentialTxIn::GetBlindingNonce(&local_718,(ConfidentialTxIn *)local_190);
    ConfidentialTxIn::GetAssetEntropy(&local_730,(ConfidentialTxIn *)local_190);
    ConfidentialValue::ConfidentialValue
              (&local_758,
               (ConfidentialValue *)
               &asset_unblind.vbf.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)(local_7b0 + 0x30),
               (ConfidentialValue *)
               &token_unblind.vbf.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ByteData::ByteData((ByteData *)in_stack_fffffffffffff7a0,(ByteData *)in_stack_fffffffffffff798);
    ByteData::ByteData((ByteData *)in_stack_fffffffffffff7a0,(ByteData *)in_stack_fffffffffffff798);
    this_00 = (UnblindParameter *)local_7b0;
    SetIssuance(this,uVar3,&local_718,&local_730,&local_758,(ConfidentialValue *)(local_7b0 + 0x30),
                (ByteData *)(local_7b0 + 0x18),(ByteData *)this_00);
    ByteData::~ByteData((ByteData *)0x4e34bc);
    ByteData::~ByteData((ByteData *)0x4e34c8);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4e34d4);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4e34e0);
    ByteData256::~ByteData256((ByteData256 *)0x4e34ec);
    ByteData256::~ByteData256((ByteData256 *)0x4e34f8);
    ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::vector
              ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
               0x4e350b);
    ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
    push_back(__return_storage_ptr__,(value_type *)&token_unblind.value.version_);
    ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
    push_back(__return_storage_ptr__,(value_type *)local_488);
    UnblindParameter::~UnblindParameter(this_00);
    UnblindParameter::~UnblindParameter(this_00);
    ByteData::~ByteData((ByteData *)0x4e3664);
    ByteData::~ByteData((ByteData *)0x4e3670);
    IssuanceParameter::~IssuanceParameter((IssuanceParameter *)this_00);
    ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)local_190);
    return __return_storage_ptr__;
  }
  local_250.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_250.filename = local_250.filename + 1;
  local_250.line = 0xb3a;
  local_250.funcname = "UnblindTxIn";
  logger::warn<unsigned_int&>
            (&local_250,"Failed to unblind TxIn. Target TxIn already unblinded.: tx_in_index=[{}]",
             (uint *)((long)&blinding_key_local + 4));
  issue.token._38_1_ = 1;
  uVar5 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_270,"Failed to unblind TxIn. Target TxIn already unblinded.",
             (allocator *)&issue.token.field_0x27);
  CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffff7c0,error_code,
             (string *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
  issue.token._38_1_ = 0;
  __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<UnblindParameter> ConfidentialTransaction::UnblindTxIn(
    uint32_t tx_in_index, const Privkey &blinding_key,
    const Privkey token_blinding_key) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  ConfidentialTxIn tx_in(vin_[tx_in_index]);
  if (((!tx_in.GetIssuanceAmount().HasBlinding()) &&
       (!tx_in.GetInflationKeys().HasBlinding())) ||
      ((tx_in.GetIssuanceAmountRangeproof().GetDataSize() == 0) &&
       (tx_in.GetInflationKeysRangeproof().GetDataSize() == 0))) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to unblind TxIn. Target TxIn already unblinded.: "
        "tx_in_index=[{}]",
        tx_in_index);
    throw CfdException(
        kCfdIllegalStateError,
        "Failed to unblind TxIn. Target TxIn already unblinded.");
  }

  IssuanceParameter issue = CalculateIssuanceValue(
      tx_in.GetTxid(), tx_in.GetVout(), true, tx_in.GetAssetEntropy(),
      tx_in.GetBlindingNonce());

  ByteData amount_rangeproof = tx_in.GetIssuanceAmountRangeproof();
  ByteData token_rangeproof = tx_in.GetInflationKeysRangeproof();

  UnblindParameter asset_unblind;
  UnblindParameter token_unblind;

  if (tx_in.GetIssuanceAmount().HasBlinding()) {
    asset_unblind = CalculateUnblindIssueData(
        blinding_key, amount_rangeproof, tx_in.GetIssuanceAmount(), Script(),
        issue.asset);
    amount_rangeproof = ByteData();
  }

  if (tx_in.GetInflationKeysRangeproof().GetDataSize() != 0) {
    if (tx_in.GetInflationKeys().HasBlinding()) {
      token_unblind = CalculateUnblindIssueData(
          (token_blinding_key.IsValid()) ? token_blinding_key : blinding_key,
          token_rangeproof, tx_in.GetInflationKeys(), Script(), issue.token);
      token_rangeproof = ByteData();
    }
  }

  // clear and set unblind value to txin
  SetIssuance(
      tx_in_index, tx_in.GetBlindingNonce(), tx_in.GetAssetEntropy(),
      asset_unblind.value, token_unblind.value, amount_rangeproof,
      token_rangeproof);
  std::vector<UnblindParameter> result;
  result.push_back(asset_unblind);
  result.push_back(token_unblind);

  return result;
}